

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx2::SubGridIntersectorKMoeller<8,_4,_true>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ushort uVar9;
  ushort uVar10;
  uint uVar11;
  uint uVar12;
  Geometry *pGVar13;
  RTCFilterFunctionN p_Var14;
  long lVar15;
  undefined1 auVar16 [16];
  uint uVar17;
  uint uVar18;
  uint uVar19;
  float fVar20;
  float fVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  byte bVar35;
  int iVar36;
  uint uVar37;
  undefined4 uVar38;
  ulong uVar39;
  long lVar40;
  ulong uVar41;
  long lVar42;
  ulong uVar43;
  long lVar44;
  uint uVar45;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  ulong uVar49;
  uint uVar50;
  ulong uVar51;
  ulong uVar52;
  long lVar53;
  bool bVar54;
  bool bVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  float fVar60;
  float fVar61;
  float fVar69;
  float fVar71;
  float fVar72;
  float fVar73;
  undefined1 auVar62 [16];
  float fVar68;
  float fVar70;
  float fVar74;
  float fVar75;
  float fVar76;
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar77 [16];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [16];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [64];
  undefined1 auVar92 [16];
  undefined1 auVar93 [32];
  undefined1 auVar94 [64];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [64];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [64];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [64];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [64];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [64];
  undefined1 auVar112 [64];
  RTCFilterFunctionNArguments args;
  float old_t;
  NodeRef stack [564];
  undefined8 local_1680;
  undefined1 local_1660 [16];
  undefined1 (*local_1648) [16];
  ulong local_1640;
  ulong local_1638;
  ulong local_1630;
  ulong local_1628;
  ulong local_1620;
  ulong local_1618;
  ulong *local_1610;
  ulong local_1608;
  ulong local_1600;
  ulong local_15f8;
  ulong local_15f0;
  ulong local_15e8;
  ulong local_15e0;
  long local_15d8;
  long local_15d0;
  long local_15c8;
  RTCFilterFunctionNArguments local_15c0;
  undefined4 local_1590;
  undefined4 uStack_158c;
  undefined4 uStack_1588;
  undefined4 uStack_1584;
  undefined4 local_1580;
  undefined4 uStack_157c;
  undefined4 uStack_1578;
  undefined4 uStack_1574;
  undefined4 local_1570;
  undefined4 uStack_156c;
  undefined4 uStack_1568;
  undefined4 uStack_1564;
  float local_1560;
  float fStack_155c;
  float fStack_1558;
  float fStack_1554;
  undefined1 local_1550 [16];
  undefined8 local_1540;
  undefined8 uStack_1538;
  undefined1 local_1530 [16];
  uint local_1520;
  uint uStack_151c;
  uint uStack_1518;
  uint uStack_1514;
  uint uStack_1510;
  uint uStack_150c;
  uint uStack_1508;
  uint uStack_1504;
  float local_1500;
  float fStack_14fc;
  float fStack_14f8;
  float fStack_14f4;
  float fStack_14f0;
  float fStack_14ec;
  float fStack_14e8;
  float fStack_14e4;
  undefined1 local_14e0 [32];
  undefined1 local_14c0 [8];
  float fStack_14b8;
  float fStack_14b4;
  float fStack_14b0;
  float fStack_14ac;
  float fStack_14a8;
  undefined1 local_14a0 [32];
  undefined1 local_1480 [32];
  undefined1 local_1460 [32];
  undefined1 local_1440 [32];
  undefined1 local_1420 [32];
  undefined1 local_1400 [32];
  undefined1 local_13e0 [32];
  undefined1 local_13c0 [32];
  undefined4 local_13a0;
  undefined4 uStack_139c;
  undefined4 uStack_1398;
  undefined4 uStack_1394;
  undefined4 uStack_1390;
  undefined4 uStack_138c;
  undefined4 uStack_1388;
  undefined4 uStack_1384;
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  undefined1 local_12e0 [32];
  float local_12c0 [4];
  float fStack_12b0;
  float fStack_12ac;
  float fStack_12a8;
  float fStack_12a4;
  float local_12a0 [4];
  float fStack_1290;
  float fStack_128c;
  float fStack_1288;
  float fStack_1284;
  float local_1280 [4];
  float fStack_1270;
  float fStack_126c;
  float fStack_1268;
  float fStack_1264;
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  undefined1 local_1220 [32];
  size_t local_1200;
  ulong local_11f8 [569];
  
  local_1610 = local_11f8;
  local_1200 = root.ptr;
  fVar1 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar112 = ZEXT3264(CONCAT428(fVar1,CONCAT424(fVar1,CONCAT420(fVar1,CONCAT416(fVar1,CONCAT412(
                                                  fVar1,CONCAT48(fVar1,CONCAT44(fVar1,fVar1))))))));
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_13c0._4_4_ = fVar2;
  local_13c0._0_4_ = fVar2;
  local_13c0._8_4_ = fVar2;
  local_13c0._12_4_ = fVar2;
  local_13c0._16_4_ = fVar2;
  local_13c0._20_4_ = fVar2;
  local_13c0._24_4_ = fVar2;
  local_13c0._28_4_ = fVar2;
  auVar91 = ZEXT3264(local_13c0);
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_13e0._4_4_ = fVar3;
  local_13e0._0_4_ = fVar3;
  local_13e0._8_4_ = fVar3;
  local_13e0._12_4_ = fVar3;
  local_13e0._16_4_ = fVar3;
  local_13e0._20_4_ = fVar3;
  local_13e0._24_4_ = fVar3;
  local_13e0._28_4_ = fVar3;
  auVar94 = ZEXT3264(local_13e0);
  fVar1 = fVar1 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar2 = fVar2 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar3 = fVar3 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  uVar43 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar46 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar47 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar48 = uVar43 ^ 0x20;
  uVar41 = uVar46 ^ 0x20;
  uVar51 = uVar47 ^ 0x20;
  local_1400._0_8_ = CONCAT44(fVar1,fVar1) ^ 0x8000000080000000;
  local_1400._8_4_ = -fVar1;
  local_1400._12_4_ = -fVar1;
  local_1400._16_4_ = -fVar1;
  local_1400._20_4_ = -fVar1;
  local_1400._24_4_ = -fVar1;
  local_1400._28_4_ = -fVar1;
  auVar98 = ZEXT3264(local_1400);
  local_1420._0_8_ = CONCAT44(fVar2,fVar2) ^ 0x8000000080000000;
  local_1420._8_4_ = -fVar2;
  local_1420._12_4_ = -fVar2;
  local_1420._16_4_ = -fVar2;
  local_1420._20_4_ = -fVar2;
  local_1420._24_4_ = -fVar2;
  local_1420._28_4_ = -fVar2;
  auVar101 = ZEXT3264(local_1420);
  iVar36 = (tray->tnear).field_0.i[k];
  local_1440._4_4_ = iVar36;
  local_1440._0_4_ = iVar36;
  local_1440._8_4_ = iVar36;
  local_1440._12_4_ = iVar36;
  local_1440._16_4_ = iVar36;
  local_1440._20_4_ = iVar36;
  local_1440._24_4_ = iVar36;
  local_1440._28_4_ = iVar36;
  auVar104 = ZEXT3264(local_1440);
  iVar36 = (tray->tfar).field_0.i[k];
  local_1460._4_4_ = iVar36;
  local_1460._0_4_ = iVar36;
  local_1460._8_4_ = iVar36;
  local_1460._12_4_ = iVar36;
  local_1460._16_4_ = iVar36;
  local_1460._20_4_ = iVar36;
  local_1460._24_4_ = iVar36;
  local_1460._28_4_ = iVar36;
  auVar107 = ZEXT3264(local_1460);
  local_13a0 = 0x80000000;
  uStack_139c = 0x80000000;
  uStack_1398 = 0x80000000;
  uStack_1394 = 0x80000000;
  uStack_1390 = 0x80000000;
  uStack_138c = 0x80000000;
  uStack_1388 = 0x80000000;
  uStack_1384 = 0x80000000;
  local_1480._0_8_ = CONCAT44(fVar3,fVar3) ^ 0x8000000080000000;
  local_1480._8_4_ = -fVar3;
  local_1480._12_4_ = -fVar3;
  local_1480._16_4_ = -fVar3;
  local_1480._20_4_ = -fVar3;
  local_1480._24_4_ = -fVar3;
  local_1480._28_4_ = -fVar3;
  auVar111 = ZEXT3264(local_1480);
  local_15e0 = uVar43 >> 2;
  local_14a0._16_16_ = mm_lookupmask_ps._240_16_;
  local_14a0._0_16_ = mm_lookupmask_ps._0_16_;
  local_15e8 = uVar48 >> 2;
  local_1648 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  local_15f0 = uVar46 >> 2;
  local_15f8 = uVar41 >> 2;
  local_1600 = uVar47 >> 2;
  local_1608 = uVar51 >> 2;
  auVar97._8_4_ = 0xbf800000;
  auVar97._0_8_ = 0xbf800000bf800000;
  auVar97._12_4_ = 0xbf800000;
  auVar97._16_4_ = 0xbf800000;
  auVar97._20_4_ = 0xbf800000;
  auVar97._24_4_ = 0xbf800000;
  auVar97._28_4_ = 0xbf800000;
  auVar78._8_4_ = 0x3f800000;
  auVar78._0_8_ = 0x3f8000003f800000;
  auVar78._12_4_ = 0x3f800000;
  auVar78._16_4_ = 0x3f800000;
  auVar78._20_4_ = 0x3f800000;
  auVar78._24_4_ = 0x3f800000;
  auVar78._28_4_ = 0x3f800000;
  _local_14c0 = vblendvps_avx(auVar78,auVar97,local_14a0);
  bVar55 = true;
  local_1640 = uVar51;
  local_1638 = uVar41;
  local_1630 = uVar48;
  local_1628 = uVar47;
  local_1620 = uVar46;
  local_1618 = uVar43;
  do {
    uVar49 = local_1610[-1];
    local_1610 = local_1610 + -1;
    while ((uVar49 & 8) == 0) {
      auVar56 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar49 + 0x40 + uVar43),auVar98._0_32_,
                                auVar112._0_32_);
      auVar22 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar49 + 0x40 + uVar46),auVar101._0_32_,
                                auVar91._0_32_);
      auVar97 = vpmaxsd_avx2(ZEXT1632(auVar56),ZEXT1632(auVar22));
      auVar56 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar49 + 0x40 + uVar47),auVar111._0_32_,
                                auVar94._0_32_);
      auVar22 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar49 + 0x40 + uVar48),auVar98._0_32_,
                                auVar112._0_32_);
      auVar23 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar49 + 0x40 + uVar41),auVar101._0_32_,
                                auVar91._0_32_);
      auVar63 = vpminsd_avx2(ZEXT1632(auVar22),ZEXT1632(auVar23));
      auVar22 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar49 + 0x40 + uVar51),auVar111._0_32_,
                                auVar94._0_32_);
      auVar78 = vpmaxsd_avx2(ZEXT1632(auVar56),auVar104._0_32_);
      auVar97 = vpmaxsd_avx2(auVar97,auVar78);
      auVar78 = vpminsd_avx2(ZEXT1632(auVar22),auVar107._0_32_);
      auVar78 = vpminsd_avx2(auVar63,auVar78);
      auVar97 = vpcmpgtd_avx2(auVar97,auVar78);
      iVar36 = vmovmskps_avx(auVar97);
      if (iVar36 == 0xff) {
        bVar55 = local_1610 != &local_1200;
        goto joined_r0x005fae12;
      }
      bVar35 = ~(byte)iVar36;
      uVar52 = uVar49 & 0xfffffffffffffff0;
      lVar40 = 0;
      for (uVar49 = (ulong)bVar35; (uVar49 & 1) == 0; uVar49 = uVar49 >> 1 | 0x8000000000000000) {
        lVar40 = lVar40 + 1;
      }
      uVar49 = *(ulong *)(uVar52 + lVar40 * 8);
      uVar37 = bVar35 - 1 & (uint)bVar35;
      uVar39 = (ulong)uVar37;
      if (uVar37 != 0) {
        *local_1610 = uVar49;
        lVar40 = 0;
        for (; (uVar39 & 1) == 0; uVar39 = uVar39 >> 1 | 0x8000000000000000) {
          lVar40 = lVar40 + 1;
        }
        uVar37 = uVar37 - 1 & uVar37;
        uVar39 = (ulong)uVar37;
        bVar54 = uVar37 == 0;
        while( true ) {
          local_1610 = local_1610 + 1;
          uVar49 = *(ulong *)(uVar52 + lVar40 * 8);
          if (bVar54) break;
          *local_1610 = uVar49;
          lVar40 = 0;
          for (uVar49 = uVar39; (uVar49 & 1) == 0; uVar49 = uVar49 >> 1 | 0x8000000000000000) {
            lVar40 = lVar40 + 1;
          }
          uVar39 = uVar39 - 1 & uVar39;
          bVar54 = uVar39 == 0;
        }
      }
    }
    local_15d8 = (ulong)((uint)uVar49 & 0xf) - 8;
    if (local_15d8 != 0) {
      uVar49 = uVar49 & 0xfffffffffffffff0;
      local_15d0 = 0;
      do {
        lVar40 = local_15d0 * 0x90;
        local_15c8 = uVar49 + lVar40;
        auVar56._8_8_ = 0;
        auVar56._0_8_ = *(ulong *)(uVar49 + 0x40 + lVar40);
        auVar23 = vpmovzxbw_avx(auVar56);
        auVar22._8_8_ = 0;
        auVar22._0_8_ = *(ulong *)(uVar49 + 0x48 + lVar40);
        auVar56 = vpmovzxbw_avx(auVar22);
        auVar56 = vpminuw_avx(auVar23,auVar56);
        auVar56 = vpcmpeqw_avx(auVar23,auVar56);
        auVar56 = vpacksswb_avx(auVar56,auVar56);
        uVar38 = *(undefined4 *)(uVar49 + 0x70 + lVar40);
        auVar63._4_4_ = uVar38;
        auVar63._0_4_ = uVar38;
        auVar63._8_4_ = uVar38;
        auVar63._12_4_ = uVar38;
        auVar63._16_4_ = uVar38;
        auVar63._20_4_ = uVar38;
        auVar63._24_4_ = uVar38;
        auVar63._28_4_ = uVar38;
        uVar38 = *(undefined4 *)(uVar49 + 0x7c + lVar40);
        auVar79._4_4_ = uVar38;
        auVar79._0_4_ = uVar38;
        auVar79._8_4_ = uVar38;
        auVar79._12_4_ = uVar38;
        auVar79._16_4_ = uVar38;
        auVar79._20_4_ = uVar38;
        auVar79._24_4_ = uVar38;
        auVar79._28_4_ = uVar38;
        auVar23._8_8_ = 0;
        auVar23._0_8_ = *(ulong *)(local_15e0 + 0x40 + local_15c8);
        auVar97 = vpmovzxbd_avx2(auVar23);
        auVar97 = vcvtdq2ps_avx(auVar97);
        auVar22 = vfmadd213ps_fma(auVar97,auVar79,auVar63);
        auVar4._8_8_ = 0;
        auVar4._0_8_ = *(ulong *)(local_15e8 + 0x40 + local_15c8);
        auVar97 = vpmovzxbd_avx2(auVar4);
        auVar97 = vcvtdq2ps_avx(auVar97);
        auVar23 = vfmadd213ps_fma(auVar97,auVar79,auVar63);
        uVar38 = *(undefined4 *)(uVar49 + 0x74 + lVar40);
        auVar64._4_4_ = uVar38;
        auVar64._0_4_ = uVar38;
        auVar64._8_4_ = uVar38;
        auVar64._12_4_ = uVar38;
        auVar64._16_4_ = uVar38;
        auVar64._20_4_ = uVar38;
        auVar64._24_4_ = uVar38;
        auVar64._28_4_ = uVar38;
        uVar38 = *(undefined4 *)(uVar49 + 0x80 + lVar40);
        auVar80._4_4_ = uVar38;
        auVar80._0_4_ = uVar38;
        auVar80._8_4_ = uVar38;
        auVar80._12_4_ = uVar38;
        auVar80._16_4_ = uVar38;
        auVar80._20_4_ = uVar38;
        auVar80._24_4_ = uVar38;
        auVar80._28_4_ = uVar38;
        auVar5._8_8_ = 0;
        auVar5._0_8_ = *(ulong *)(local_15f0 + 0x40 + local_15c8);
        auVar97 = vpmovzxbd_avx2(auVar5);
        auVar97 = vcvtdq2ps_avx(auVar97);
        auVar4 = vfmadd213ps_fma(auVar97,auVar80,auVar64);
        auVar6._8_8_ = 0;
        auVar6._0_8_ = *(ulong *)(local_15f8 + 0x40 + local_15c8);
        auVar97 = vpmovzxbd_avx2(auVar6);
        auVar97 = vcvtdq2ps_avx(auVar97);
        auVar5 = vfmadd213ps_fma(auVar97,auVar80,auVar64);
        uVar38 = *(undefined4 *)(uVar49 + 0x78 + lVar40);
        auVar65._4_4_ = uVar38;
        auVar65._0_4_ = uVar38;
        auVar65._8_4_ = uVar38;
        auVar65._12_4_ = uVar38;
        auVar65._16_4_ = uVar38;
        auVar65._20_4_ = uVar38;
        auVar65._24_4_ = uVar38;
        auVar65._28_4_ = uVar38;
        uVar38 = *(undefined4 *)(uVar49 + 0x84 + lVar40);
        auVar81._4_4_ = uVar38;
        auVar81._0_4_ = uVar38;
        auVar81._8_4_ = uVar38;
        auVar81._12_4_ = uVar38;
        auVar81._16_4_ = uVar38;
        auVar81._20_4_ = uVar38;
        auVar81._24_4_ = uVar38;
        auVar81._28_4_ = uVar38;
        auVar7._8_8_ = 0;
        auVar7._0_8_ = *(ulong *)(local_1600 + 0x40 + local_15c8);
        auVar97 = vpmovzxbd_avx2(auVar7);
        auVar97 = vcvtdq2ps_avx(auVar97);
        auVar6 = vfmadd213ps_fma(auVar97,auVar81,auVar65);
        auVar8._8_8_ = 0;
        auVar8._0_8_ = *(ulong *)(local_1608 + 0x40 + local_15c8);
        auVar97 = vpmovzxbd_avx2(auVar8);
        auVar97 = vcvtdq2ps_avx(auVar97);
        auVar7 = vfmadd213ps_fma(auVar97,auVar81,auVar65);
        auVar22 = vfmadd213ps_fma(ZEXT1632(auVar22),auVar112._0_32_,auVar98._0_32_);
        auVar4 = vfmadd213ps_fma(ZEXT1632(auVar4),auVar91._0_32_,auVar101._0_32_);
        auVar97 = vpmaxsd_avx2(ZEXT1632(auVar22),ZEXT1632(auVar4));
        auVar22 = vfmadd213ps_fma(ZEXT1632(auVar6),auVar94._0_32_,auVar111._0_32_);
        auVar23 = vfmadd213ps_fma(ZEXT1632(auVar23),auVar112._0_32_,auVar98._0_32_);
        auVar4 = vfmadd213ps_fma(ZEXT1632(auVar5),auVar91._0_32_,auVar101._0_32_);
        auVar63 = vpminsd_avx2(ZEXT1632(auVar23),ZEXT1632(auVar4));
        auVar23 = vfmadd213ps_fma(ZEXT1632(auVar7),auVar94._0_32_,auVar111._0_32_);
        auVar78 = vpmaxsd_avx2(ZEXT1632(auVar22),auVar104._0_32_);
        auVar97 = vpmaxsd_avx2(auVar97,auVar78);
        auVar78 = vpminsd_avx2(ZEXT1632(auVar23),auVar107._0_32_);
        auVar78 = vpminsd_avx2(auVar63,auVar78);
        auVar97 = vpcmpgtd_avx2(auVar97,auVar78);
        uVar38 = vmovmskps_avx(auVar97);
        bVar35 = ~(byte)uVar38 &
                 (SUB161(auVar56 >> 7,0) & 1 | (SUB161(auVar56 >> 0xf,0) & 1) << 1 |
                  (SUB161(auVar56 >> 0x17,0) & 1) << 2 | (SUB161(auVar56 >> 0x1f,0) & 1) << 3 |
                  (SUB161(auVar56 >> 0x27,0) & 1) << 4 | (SUB161(auVar56 >> 0x2f,0) & 1) << 5 |
                  (SUB161(auVar56 >> 0x37,0) & 1) << 6 | SUB161(auVar56 >> 0x3f,0) << 7);
        if (bVar35 != 0) {
          uVar41 = (ulong)bVar35;
          do {
            lVar40 = 0;
            for (uVar43 = uVar41; (uVar43 & 1) == 0; uVar43 = uVar43 >> 1 | 0x8000000000000000) {
              lVar40 = lVar40 + 1;
            }
            uVar9 = *(ushort *)(local_15c8 + lVar40 * 8);
            uVar10 = *(ushort *)(local_15c8 + 2 + lVar40 * 8);
            uVar37 = *(uint *)(local_15c8 + 0x88);
            uVar11 = *(uint *)(local_15c8 + 4 + lVar40 * 8);
            pGVar13 = (context->scene->geometries).items[uVar37].ptr;
            lVar40 = *(long *)&pGVar13->field_0x58;
            lVar44 = pGVar13[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i *
                     (ulong)uVar11;
            uVar45 = uVar9 & 0x7fff;
            uVar50 = uVar10 & 0x7fff;
            uVar12 = *(uint *)(lVar40 + 4 + lVar44);
            uVar47 = (ulong)uVar12;
            uVar46 = (ulong)(uVar12 * uVar50 + *(int *)(lVar40 + lVar44) + uVar45);
            p_Var14 = pGVar13[1].intersectionFilterN;
            lVar15 = *(long *)&pGVar13[1].time_range.upper;
            auVar56 = *(undefined1 (*) [16])(lVar15 + (uVar46 + 1) * (long)p_Var14);
            auVar22 = *(undefined1 (*) [16])(lVar15 + (uVar46 + uVar47) * (long)p_Var14);
            lVar53 = uVar46 + uVar47 + 1;
            auVar23 = *(undefined1 (*) [16])(lVar15 + lVar53 * (long)p_Var14);
            auVar4 = *(undefined1 (*) [16])
                      (lVar15 + (uVar46 + (-1 < (short)uVar9) + 1) * (long)p_Var14);
            lVar42 = (ulong)(-1 < (short)uVar9) + lVar53;
            auVar5 = *(undefined1 (*) [16])(lVar15 + lVar42 * (long)p_Var14);
            uVar43 = 0;
            if (-1 < (short)uVar10) {
              uVar43 = uVar47;
            }
            auVar6 = *(undefined1 (*) [16])(lVar15 + (uVar46 + uVar47 + uVar43) * (long)p_Var14);
            auVar7 = *(undefined1 (*) [16])(lVar15 + (lVar53 + uVar43) * (long)p_Var14);
            auVar89._16_16_ = *(undefined1 (*) [16])(lVar15 + (uVar43 + lVar42) * (long)p_Var14);
            auVar89._0_16_ = auVar23;
            auVar85 = vunpcklps_avx(auVar56,auVar5);
            auVar8 = vunpckhps_avx(auVar56,auVar5);
            auVar92 = vunpcklps_avx(auVar4,auVar23);
            auVar4 = vunpckhps_avx(auVar4,auVar23);
            auVar77 = vunpcklps_avx(auVar8,auVar4);
            auVar62 = vunpcklps_avx(auVar85,auVar92);
            auVar4 = vunpckhps_avx(auVar85,auVar92);
            auVar85 = vunpcklps_avx(auVar22,auVar7);
            auVar8 = vunpckhps_avx(auVar22,auVar7);
            auVar92 = vunpcklps_avx(auVar23,auVar6);
            auVar6 = vunpckhps_avx(auVar23,auVar6);
            auVar8 = vunpcklps_avx(auVar8,auVar6);
            auVar16 = vunpcklps_avx(auVar85,auVar92);
            auVar6 = vunpckhps_avx(auVar85,auVar92);
            auVar82._16_16_ = auVar7;
            auVar82._0_16_ = auVar22;
            auVar66._16_16_ = auVar5;
            auVar66._0_16_ = auVar56;
            auVar97 = vunpcklps_avx(auVar66,auVar82);
            auVar57._16_16_ = auVar23;
            auVar57._0_16_ = *(undefined1 (*) [16])(lVar15 + (long)p_Var14 * uVar46);
            auVar78 = vunpcklps_avx(auVar57,auVar89);
            auVar80 = vunpcklps_avx(auVar78,auVar97);
            auVar81 = vunpckhps_avx(auVar78,auVar97);
            auVar97 = vunpckhps_avx(auVar66,auVar82);
            auVar78 = vunpckhps_avx(auVar57,auVar89);
            auVar57 = vunpcklps_avx(auVar78,auVar97);
            auVar58._16_16_ = auVar62;
            auVar58._0_16_ = auVar62;
            auVar83._16_16_ = auVar4;
            auVar83._0_16_ = auVar4;
            auVar86._16_16_ = auVar77;
            auVar86._0_16_ = auVar77;
            auVar88._16_16_ = auVar16;
            auVar88._0_16_ = auVar16;
            auVar95._16_16_ = auVar6;
            auVar95._0_16_ = auVar6;
            auVar99._16_16_ = auVar8;
            auVar99._0_16_ = auVar8;
            auVar78 = vsubps_avx(auVar80,auVar58);
            auVar97 = vsubps_avx(auVar81,auVar83);
            auVar63 = vsubps_avx(auVar57,auVar86);
            auVar64 = vsubps_avx(auVar88,auVar80);
            auVar65 = vsubps_avx(auVar95,auVar81);
            auVar79 = vsubps_avx(auVar99,auVar57);
            auVar24._4_4_ = auVar97._4_4_ * auVar79._4_4_;
            auVar24._0_4_ = auVar97._0_4_ * auVar79._0_4_;
            auVar24._8_4_ = auVar97._8_4_ * auVar79._8_4_;
            auVar24._12_4_ = auVar97._12_4_ * auVar79._12_4_;
            auVar24._16_4_ = auVar97._16_4_ * auVar79._16_4_;
            auVar24._20_4_ = auVar97._20_4_ * auVar79._20_4_;
            auVar24._24_4_ = auVar97._24_4_ * auVar79._24_4_;
            auVar24._28_4_ = auVar62._12_4_;
            auVar5 = vfmsub231ps_fma(auVar24,auVar65,auVar63);
            uVar38 = *(undefined4 *)(ray + k * 4);
            auVar102._4_4_ = uVar38;
            auVar102._0_4_ = uVar38;
            auVar102._8_4_ = uVar38;
            auVar102._12_4_ = uVar38;
            auVar102._16_4_ = uVar38;
            auVar102._20_4_ = uVar38;
            auVar102._24_4_ = uVar38;
            auVar102._28_4_ = uVar38;
            uVar38 = *(undefined4 *)(ray + k * 4 + 0x10);
            auVar105._4_4_ = uVar38;
            auVar105._0_4_ = uVar38;
            auVar105._8_4_ = uVar38;
            auVar105._12_4_ = uVar38;
            auVar105._16_4_ = uVar38;
            auVar105._20_4_ = uVar38;
            auVar105._24_4_ = uVar38;
            auVar105._28_4_ = uVar38;
            uVar38 = *(undefined4 *)(ray + k * 4 + 0x20);
            auVar108._4_4_ = uVar38;
            auVar108._0_4_ = uVar38;
            auVar108._8_4_ = uVar38;
            auVar108._12_4_ = uVar38;
            auVar108._16_4_ = uVar38;
            auVar108._20_4_ = uVar38;
            auVar108._24_4_ = uVar38;
            auVar108._28_4_ = uVar38;
            fVar1 = *(float *)(ray + k * 4 + 0x40);
            auVar96._4_4_ = fVar1;
            auVar96._0_4_ = fVar1;
            auVar96._8_4_ = fVar1;
            auVar96._12_4_ = fVar1;
            auVar96._16_4_ = fVar1;
            auVar96._20_4_ = fVar1;
            auVar96._24_4_ = fVar1;
            auVar96._28_4_ = fVar1;
            auVar25._4_4_ = auVar63._4_4_ * auVar64._4_4_;
            auVar25._0_4_ = auVar63._0_4_ * auVar64._0_4_;
            auVar25._8_4_ = auVar63._8_4_ * auVar64._8_4_;
            auVar25._12_4_ = auVar63._12_4_ * auVar64._12_4_;
            auVar25._16_4_ = auVar63._16_4_ * auVar64._16_4_;
            auVar25._20_4_ = auVar63._20_4_ * auVar64._20_4_;
            auVar25._24_4_ = auVar63._24_4_ * auVar64._24_4_;
            auVar25._28_4_ = auVar4._12_4_;
            auVar80 = vsubps_avx(auVar80,auVar102);
            fVar2 = *(float *)(ray + k * 4 + 0x50);
            auVar103._4_4_ = fVar2;
            auVar103._0_4_ = fVar2;
            auVar103._8_4_ = fVar2;
            auVar103._12_4_ = fVar2;
            auVar103._16_4_ = fVar2;
            auVar103._20_4_ = fVar2;
            auVar103._24_4_ = fVar2;
            auVar103._28_4_ = fVar2;
            auVar4 = vfmsub231ps_fma(auVar25,auVar79,auVar78);
            auVar81 = vsubps_avx(auVar81,auVar105);
            fVar3 = *(float *)(ray + k * 4 + 0x60);
            auVar106._4_4_ = fVar3;
            auVar106._0_4_ = fVar3;
            auVar106._8_4_ = fVar3;
            auVar106._12_4_ = fVar3;
            auVar106._16_4_ = fVar3;
            auVar106._20_4_ = fVar3;
            auVar106._24_4_ = fVar3;
            auVar106._28_4_ = fVar3;
            auVar57 = vsubps_avx(auVar57,auVar108);
            auVar26._4_4_ = fVar1 * auVar81._4_4_;
            auVar26._0_4_ = fVar1 * auVar81._0_4_;
            auVar26._8_4_ = fVar1 * auVar81._8_4_;
            auVar26._12_4_ = fVar1 * auVar81._12_4_;
            auVar26._16_4_ = fVar1 * auVar81._16_4_;
            auVar26._20_4_ = fVar1 * auVar81._20_4_;
            auVar26._24_4_ = fVar1 * auVar81._24_4_;
            auVar26._28_4_ = uVar38;
            auVar56 = vfmsub231ps_fma(auVar26,auVar80,auVar103);
            auVar27._4_4_ = auVar79._4_4_ * auVar56._4_4_;
            auVar27._0_4_ = auVar79._0_4_ * auVar56._0_4_;
            auVar27._8_4_ = auVar79._8_4_ * auVar56._8_4_;
            auVar27._12_4_ = auVar79._12_4_ * auVar56._12_4_;
            auVar27._16_4_ = auVar79._16_4_ * 0.0;
            auVar27._20_4_ = auVar79._20_4_ * 0.0;
            auVar27._24_4_ = auVar79._24_4_ * 0.0;
            auVar27._28_4_ = auVar79._28_4_;
            auVar28._4_4_ = auVar63._4_4_ * auVar56._4_4_;
            auVar28._0_4_ = auVar63._0_4_ * auVar56._0_4_;
            auVar28._8_4_ = auVar63._8_4_ * auVar56._8_4_;
            auVar28._12_4_ = auVar63._12_4_ * auVar56._12_4_;
            auVar28._16_4_ = auVar63._16_4_ * 0.0;
            auVar28._20_4_ = auVar63._20_4_ * 0.0;
            auVar28._24_4_ = auVar63._24_4_ * 0.0;
            auVar28._28_4_ = auVar63._28_4_;
            auVar109._0_4_ = fVar3 * auVar80._0_4_;
            auVar109._4_4_ = fVar3 * auVar80._4_4_;
            auVar109._8_4_ = fVar3 * auVar80._8_4_;
            auVar109._12_4_ = fVar3 * auVar80._12_4_;
            auVar109._16_4_ = fVar3 * auVar80._16_4_;
            auVar109._20_4_ = fVar3 * auVar80._20_4_;
            auVar109._24_4_ = fVar3 * auVar80._24_4_;
            auVar109._28_4_ = 0;
            auVar22 = vfmsub231ps_fma(auVar109,auVar57,auVar96);
            auVar56 = vfmadd231ps_fma(auVar27,ZEXT1632(auVar22),auVar65);
            auVar22 = vfmadd231ps_fma(auVar28,auVar97,ZEXT1632(auVar22));
            auVar29._4_4_ = auVar78._4_4_ * auVar65._4_4_;
            auVar29._0_4_ = auVar78._0_4_ * auVar65._0_4_;
            auVar29._8_4_ = auVar78._8_4_ * auVar65._8_4_;
            auVar29._12_4_ = auVar78._12_4_ * auVar65._12_4_;
            auVar29._16_4_ = auVar78._16_4_ * auVar65._16_4_;
            auVar29._20_4_ = auVar78._20_4_ * auVar65._20_4_;
            auVar29._24_4_ = auVar78._24_4_ * auVar65._24_4_;
            auVar29._28_4_ = auVar65._28_4_;
            auVar23 = vfmsub231ps_fma(auVar29,auVar64,auVar97);
            auVar110._0_4_ = fVar2 * auVar57._0_4_;
            auVar110._4_4_ = fVar2 * auVar57._4_4_;
            auVar110._8_4_ = fVar2 * auVar57._8_4_;
            auVar110._12_4_ = fVar2 * auVar57._12_4_;
            auVar110._16_4_ = fVar2 * auVar57._16_4_;
            auVar110._20_4_ = fVar2 * auVar57._20_4_;
            auVar110._24_4_ = fVar2 * auVar57._24_4_;
            auVar110._28_4_ = 0;
            auVar6 = vfmsub231ps_fma(auVar110,auVar81,auVar106);
            fVar1 = auVar23._0_4_;
            fVar2 = auVar23._4_4_;
            auVar30._4_4_ = fVar3 * fVar2;
            auVar30._0_4_ = fVar3 * fVar1;
            fVar61 = auVar23._8_4_;
            auVar30._8_4_ = fVar3 * fVar61;
            fVar69 = auVar23._12_4_;
            auVar30._12_4_ = fVar3 * fVar69;
            auVar30._16_4_ = fVar3 * 0.0;
            auVar30._20_4_ = fVar3 * 0.0;
            auVar30._24_4_ = fVar3 * 0.0;
            auVar30._28_4_ = fVar3;
            auVar23 = vfmadd231ps_fma(auVar30,ZEXT1632(auVar4),auVar103);
            auVar23 = vfmadd231ps_fma(ZEXT1632(auVar23),ZEXT1632(auVar5),auVar96);
            auVar56 = vfmadd231ps_fma(ZEXT1632(auVar56),ZEXT1632(auVar6),auVar64);
            auVar34._4_4_ = uStack_139c;
            auVar34._0_4_ = local_13a0;
            auVar34._8_4_ = uStack_1398;
            auVar34._12_4_ = uStack_1394;
            auVar34._16_4_ = uStack_1390;
            auVar34._20_4_ = uStack_138c;
            auVar34._24_4_ = uStack_1388;
            auVar34._28_4_ = uStack_1384;
            auVar97 = vandps_avx(ZEXT1632(auVar23),auVar34);
            uVar12 = auVar97._0_4_;
            auVar90._0_4_ = (float)(auVar56._0_4_ ^ uVar12);
            uVar17 = auVar97._4_4_;
            auVar90._4_4_ = (float)(auVar56._4_4_ ^ uVar17);
            uVar18 = auVar97._8_4_;
            auVar90._8_4_ = (float)(auVar56._8_4_ ^ uVar18);
            uVar19 = auVar97._12_4_;
            auVar90._12_4_ = (float)(auVar56._12_4_ ^ uVar19);
            fVar3 = auVar97._16_4_;
            auVar90._16_4_ = fVar3;
            fVar20 = auVar97._20_4_;
            auVar90._20_4_ = fVar20;
            fVar21 = auVar97._24_4_;
            auVar90._24_4_ = fVar21;
            fStack_1264 = auVar97._28_4_;
            auVar90._28_4_ = fStack_1264;
            auVar56 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar78,ZEXT1632(auVar6));
            auVar93._0_4_ = (float)(auVar56._0_4_ ^ uVar12);
            auVar93._4_4_ = (float)(auVar56._4_4_ ^ uVar17);
            auVar93._8_4_ = (float)(auVar56._8_4_ ^ uVar18);
            auVar93._12_4_ = (float)(auVar56._12_4_ ^ uVar19);
            auVar93._16_4_ = fVar3;
            auVar93._20_4_ = fVar20;
            auVar93._24_4_ = fVar21;
            auVar93._28_4_ = fStack_1264;
            auVar97 = vcmpps_avx(auVar90,ZEXT832(0) << 0x20,5);
            auVar78 = vcmpps_avx(auVar93,ZEXT832(0) << 0x20,5);
            auVar97 = vandps_avx(auVar78,auVar97);
            auVar67._8_4_ = 0x7fffffff;
            auVar67._0_8_ = 0x7fffffff7fffffff;
            auVar67._12_4_ = 0x7fffffff;
            auVar67._16_4_ = 0x7fffffff;
            auVar67._20_4_ = 0x7fffffff;
            auVar67._24_4_ = 0x7fffffff;
            auVar67._28_4_ = 0x7fffffff;
            local_1320 = vandps_avx(ZEXT1632(auVar23),auVar67);
            auVar78 = vcmpps_avx(ZEXT1632(auVar23),ZEXT832(0) << 0x20,4);
            auVar97 = vandps_avx(auVar97,auVar78);
            auVar100._0_4_ = auVar90._0_4_ + auVar93._0_4_;
            auVar100._4_4_ = auVar90._4_4_ + auVar93._4_4_;
            auVar100._8_4_ = auVar90._8_4_ + auVar93._8_4_;
            auVar100._12_4_ = auVar90._12_4_ + auVar93._12_4_;
            auVar100._16_4_ = fVar3 + fVar3;
            auVar100._20_4_ = fVar20 + fVar20;
            auVar100._24_4_ = fVar21 + fVar21;
            auVar100._28_4_ = fStack_1264 + fStack_1264;
            auVar78 = vcmpps_avx(auVar100,local_1320,2);
            auVar63 = auVar78 & auVar97;
            if ((((((((auVar63 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar63 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar63 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar63 >> 0x7f,0) != '\0') ||
                  (auVar63 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar63 >> 0xbf,0) != '\0') ||
                (auVar63 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar63[0x1f] < '\0') {
              auVar97 = vandps_avx(auVar97,auVar78);
              auVar56 = vpackssdw_avx(auVar97._0_16_,auVar97._16_16_);
              auVar31._4_4_ = fVar2 * auVar57._4_4_;
              auVar31._0_4_ = fVar1 * auVar57._0_4_;
              auVar31._8_4_ = fVar61 * auVar57._8_4_;
              auVar31._12_4_ = fVar69 * auVar57._12_4_;
              auVar31._16_4_ = auVar57._16_4_ * 0.0;
              auVar31._20_4_ = auVar57._20_4_ * 0.0;
              auVar31._24_4_ = auVar57._24_4_ * 0.0;
              auVar31._28_4_ = auVar57._28_4_;
              auVar22 = vfmadd213ps_fma(auVar81,ZEXT1632(auVar4),auVar31);
              auVar22 = vfmadd213ps_fma(auVar80,ZEXT1632(auVar5),ZEXT1632(auVar22));
              local_1340._0_4_ = (float)(uVar12 ^ auVar22._0_4_);
              local_1340._4_4_ = (float)(uVar17 ^ auVar22._4_4_);
              local_1340._8_4_ = (float)(uVar18 ^ auVar22._8_4_);
              local_1340._12_4_ = (float)(uVar19 ^ auVar22._12_4_);
              local_1340._16_4_ = fVar3;
              local_1340._20_4_ = fVar20;
              local_1340._24_4_ = fVar21;
              local_1340._28_4_ = fStack_1264;
              fVar71 = *(float *)(ray + k * 4 + 0x30);
              fVar60 = local_1320._0_4_;
              fVar68 = local_1320._4_4_;
              auVar32._4_4_ = fVar68 * fVar71;
              auVar32._0_4_ = fVar60 * fVar71;
              fVar70 = local_1320._8_4_;
              auVar32._8_4_ = fVar70 * fVar71;
              fVar72 = local_1320._12_4_;
              auVar32._12_4_ = fVar72 * fVar71;
              fVar74 = local_1320._16_4_;
              auVar32._16_4_ = fVar74 * fVar71;
              fVar75 = local_1320._20_4_;
              auVar32._20_4_ = fVar75 * fVar71;
              fVar76 = local_1320._24_4_;
              auVar32._24_4_ = fVar76 * fVar71;
              auVar32._28_4_ = fVar71;
              auVar97 = vcmpps_avx(auVar32,local_1340,1);
              local_1500 = *(float *)(ray + k * 4 + 0x80);
              auVar33._4_4_ = local_1500 * fVar68;
              auVar33._0_4_ = local_1500 * fVar60;
              auVar33._8_4_ = local_1500 * fVar70;
              auVar33._12_4_ = local_1500 * fVar72;
              auVar33._16_4_ = local_1500 * fVar74;
              auVar33._20_4_ = local_1500 * fVar75;
              auVar33._24_4_ = local_1500 * fVar76;
              auVar33._28_4_ = auVar57._28_4_;
              auVar78 = vcmpps_avx(local_1340,auVar33,2);
              auVar97 = vandps_avx(auVar97,auVar78);
              auVar22 = vpackssdw_avx(auVar97._0_16_,auVar97._16_16_);
              auVar56 = vpand_avx(auVar56,auVar22);
              auVar97 = vpmovzxwd_avx2(auVar56);
              auVar97 = vpslld_avx2(auVar97,0x1f);
              if ((((((((auVar97 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar97 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar97 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar97 >> 0x7f,0) != '\0') ||
                    (auVar97 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar97 >> 0xbf,0) != '\0') ||
                  (auVar97 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar97[0x1f] < '\0') {
                auVar78 = vsubps_avx(local_1320,auVar93);
                local_1380 = vblendvps_avx(auVar90,auVar78,local_14a0);
                auVar78 = vsubps_avx(local_1320,auVar90);
                local_1360 = vblendvps_avx(auVar93,auVar78,local_14a0);
                local_12e0 = vpsrad_avx2(auVar97,0x1f);
                local_1260._0_4_ = (float)local_14c0._0_4_ * auVar5._0_4_;
                local_1260._4_4_ = (float)local_14c0._4_4_ * auVar5._4_4_;
                local_1260._8_4_ = fStack_14b8 * auVar5._8_4_;
                local_1260._12_4_ = fStack_14b4 * auVar5._12_4_;
                local_1260._16_4_ = fStack_14b0 * 0.0;
                local_1260._20_4_ = fStack_14ac * 0.0;
                local_1260._24_4_ = fStack_14a8 * 0.0;
                local_1260._28_4_ = 0;
                local_1240._4_4_ = (float)local_14c0._4_4_ * auVar4._4_4_;
                local_1240._0_4_ = (float)local_14c0._0_4_ * auVar4._0_4_;
                local_1240._8_4_ = fStack_14b8 * auVar4._8_4_;
                local_1240._12_4_ = fStack_14b4 * auVar4._12_4_;
                local_1240._16_4_ = fStack_14b0 * 0.0;
                local_1240._20_4_ = fStack_14ac * 0.0;
                local_1240._24_4_ = fStack_14a8 * 0.0;
                local_1240._28_4_ = 0;
                local_1220._4_4_ = (float)local_14c0._4_4_ * fVar2;
                local_1220._0_4_ = (float)local_14c0._0_4_ * fVar1;
                local_1220._8_4_ = fStack_14b8 * fVar61;
                local_1220._12_4_ = fStack_14b4 * fVar69;
                local_1220._16_4_ = fStack_14b0 * 0.0;
                local_1220._20_4_ = fStack_14ac * 0.0;
                local_1220._24_4_ = fStack_14a8 * 0.0;
                local_1220._28_4_ = 0;
                if ((pGVar13->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar13->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_005fb7a0:
                    *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                    return bVar55;
                  }
                  auVar59._0_8_ = (ulong)CONCAT24(uVar9,(uint)uVar9) & 0x7fff00007fff;
                  auVar59._8_4_ = uVar45;
                  auVar59._12_4_ = uVar45;
                  auVar59._16_4_ = uVar45;
                  auVar59._20_4_ = uVar45;
                  auVar59._24_4_ = uVar45;
                  auVar59._28_4_ = uVar45;
                  auVar97 = vpaddd_avx2(auVar59,_DAT_01fec4a0);
                  auVar85._0_4_ = (float)(int)(*(ushort *)(lVar40 + 8 + lVar44) - 1);
                  auVar85._4_12_ = auVar112._4_12_;
                  auVar84._0_8_ = (ulong)CONCAT24(uVar10,(uint)uVar10) & 0x7fff00007fff;
                  auVar84._8_4_ = uVar50;
                  auVar84._12_4_ = uVar50;
                  auVar84._16_4_ = uVar50;
                  auVar84._20_4_ = uVar50;
                  auVar84._24_4_ = uVar50;
                  auVar84._28_4_ = uVar50;
                  auVar78 = vpaddd_avx2(auVar84,_DAT_01fec4c0);
                  auVar22 = vrcpss_avx(auVar85,auVar85);
                  auVar23 = vfnmadd213ss_fma(auVar85,auVar22,SUB6416(ZEXT464(0x40000000),0));
                  auVar92._0_4_ = (float)(int)(*(ushort *)(lVar40 + 10 + lVar44) - 1);
                  auVar92._4_12_ = auVar112._4_12_;
                  fVar1 = auVar22._0_4_ * auVar23._0_4_;
                  auVar22 = vrcpss_avx(auVar92,auVar92);
                  auVar23 = vfnmadd213ss_fma(auVar92,auVar22,SUB6416(ZEXT464(0x40000000),0));
                  fVar2 = auVar22._0_4_ * auVar23._0_4_;
                  auVar97 = vcvtdq2ps_avx(auVar97);
                  fStack_12a4 = auVar97._28_4_ + local_1380._28_4_;
                  auVar78 = vcvtdq2ps_avx(auVar78);
                  auVar63 = vrcpps_avx(local_1320);
                  auVar87._8_4_ = 0x3f800000;
                  auVar87._0_8_ = 0x3f8000003f800000;
                  auVar87._12_4_ = 0x3f800000;
                  auVar87._16_4_ = 0x3f800000;
                  auVar87._20_4_ = 0x3f800000;
                  auVar87._24_4_ = 0x3f800000;
                  auVar87._28_4_ = 0x3f800000;
                  auVar22 = vfnmadd213ps_fma(local_1320,auVar63,auVar87);
                  auVar22 = vfmadd132ps_fma(ZEXT1632(auVar22),auVar63,auVar63);
                  fVar61 = auVar22._0_4_;
                  fVar69 = auVar22._4_4_;
                  fVar71 = auVar22._8_4_;
                  fVar73 = auVar22._12_4_;
                  local_1280[0] = fVar61 * local_1340._0_4_;
                  local_1280[1] = fVar69 * local_1340._4_4_;
                  local_1280[2] = fVar71 * local_1340._8_4_;
                  local_1280[3] = fVar73 * local_1340._12_4_;
                  fStack_1270 = fVar3 * 0.0;
                  fStack_126c = fVar20 * 0.0;
                  fStack_1268 = fVar21 * 0.0;
                  local_12c0[0] = (fVar60 * auVar97._0_4_ + local_1380._0_4_) * fVar1 * fVar61;
                  local_12c0[1] = (fVar68 * auVar97._4_4_ + local_1380._4_4_) * fVar1 * fVar69;
                  local_12c0[2] = (fVar70 * auVar97._8_4_ + local_1380._8_4_) * fVar1 * fVar71;
                  local_12c0[3] = (fVar72 * auVar97._12_4_ + local_1380._12_4_) * fVar1 * fVar73;
                  fStack_12b0 = (fVar74 * auVar97._16_4_ + local_1380._16_4_) * fVar1 * 0.0;
                  fStack_12ac = (fVar75 * auVar97._20_4_ + local_1380._20_4_) * fVar1 * 0.0;
                  fStack_12a8 = (fVar76 * auVar97._24_4_ + local_1380._24_4_) * fVar1 * 0.0;
                  local_12a0[0] = (fVar60 * auVar78._0_4_ + local_1360._0_4_) * fVar2 * fVar61;
                  local_12a0[1] = (fVar68 * auVar78._4_4_ + local_1360._4_4_) * fVar2 * fVar69;
                  local_12a0[2] = (fVar70 * auVar78._8_4_ + local_1360._8_4_) * fVar2 * fVar71;
                  local_12a0[3] = (fVar72 * auVar78._12_4_ + local_1360._12_4_) * fVar2 * fVar73;
                  fStack_1290 = (fVar74 * auVar78._16_4_ + local_1360._16_4_) * fVar2 * 0.0;
                  fStack_128c = (fVar75 * auVar78._20_4_ + local_1360._20_4_) * fVar2 * 0.0;
                  fStack_1288 = (fVar76 * auVar78._24_4_ + local_1360._24_4_) * fVar2 * 0.0;
                  fStack_1284 = fStack_12a4;
                  auVar56 = vpsllw_avx(auVar56,0xf);
                  if ((((((((auVar56 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar56 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar56 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar56 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar56 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar56 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar56 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar56[0xf] < '\0') {
                    auVar56 = vpacksswb_avx(auVar56,auVar56);
                    uVar43 = 0;
                    uVar47 = (ulong)(byte)(SUB161(auVar56 >> 7,0) & 1 |
                                           (SUB161(auVar56 >> 0xf,0) & 1) << 1 |
                                           (SUB161(auVar56 >> 0x17,0) & 1) << 2 |
                                           (SUB161(auVar56 >> 0x1f,0) & 1) << 3 |
                                           (SUB161(auVar56 >> 0x27,0) & 1) << 4 |
                                           (SUB161(auVar56 >> 0x2f,0) & 1) << 5 |
                                           (SUB161(auVar56 >> 0x37,0) & 1) << 6 |
                                          SUB161(auVar56 >> 0x3f,0) << 7);
                    for (uVar46 = uVar47; (uVar46 & 1) == 0;
                        uVar46 = uVar46 >> 1 | 0x8000000000000000) {
                      uVar43 = uVar43 + 1;
                    }
                    local_1680 = CONCAT44(uVar11,uVar11);
                    auVar56 = *local_1648;
                    local_14e0 = auVar112._0_32_;
                    fStack_14fc = local_1500;
                    fStack_14f8 = local_1500;
                    fStack_14f4 = local_1500;
                    fStack_14f0 = local_1500;
                    fStack_14ec = local_1500;
                    fStack_14e8 = local_1500;
                    fStack_14e4 = local_1500;
                    do {
                      local_1560 = local_12c0[uVar43];
                      fVar1 = local_12a0[uVar43];
                      local_1550._4_4_ = fVar1;
                      local_1550._0_4_ = fVar1;
                      local_1550._8_4_ = fVar1;
                      local_1550._12_4_ = fVar1;
                      *(float *)(ray + k * 4 + 0x80) = local_1280[uVar43];
                      local_15c0.context = context->user;
                      local_1590 = *(undefined4 *)(local_1260 + uVar43 * 4);
                      local_1580 = *(undefined4 *)(local_1240 + uVar43 * 4);
                      local_1570 = *(undefined4 *)(local_1220 + uVar43 * 4);
                      uStack_1538 = CONCAT44(uVar11,uVar11);
                      local_1540 = local_1680;
                      local_1530._4_4_ = uVar37;
                      local_1530._0_4_ = uVar37;
                      local_1530._8_4_ = uVar37;
                      local_1530._12_4_ = uVar37;
                      vpcmpeqd_avx2(ZEXT1632(local_1530),ZEXT1632(local_1530));
                      uStack_151c = (local_15c0.context)->instID[0];
                      local_1520 = uStack_151c;
                      uStack_1518 = uStack_151c;
                      uStack_1514 = uStack_151c;
                      uStack_1510 = (local_15c0.context)->instPrimID[0];
                      uStack_150c = uStack_1510;
                      uStack_1508 = uStack_1510;
                      uStack_1504 = uStack_1510;
                      local_15c0.valid = (int *)local_1660;
                      local_15c0.geometryUserPtr = pGVar13->userPtr;
                      local_15c0.hit = (RTCHitN *)&local_1590;
                      local_15c0.N = 4;
                      local_1660 = auVar56;
                      local_15c0.ray = (RTCRayN *)ray;
                      uStack_158c = local_1590;
                      uStack_1588 = local_1590;
                      uStack_1584 = local_1590;
                      uStack_157c = local_1580;
                      uStack_1578 = local_1580;
                      uStack_1574 = local_1580;
                      uStack_156c = local_1570;
                      uStack_1568 = local_1570;
                      uStack_1564 = local_1570;
                      fStack_155c = local_1560;
                      fStack_1558 = local_1560;
                      fStack_1554 = local_1560;
                      if (pGVar13->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar13->occlusionFilterN)(&local_15c0);
                      }
                      if (local_1660 == (undefined1  [16])0x0) {
                        auVar22 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                        auVar22 = auVar22 ^ _DAT_01f7ae20;
                      }
                      else {
                        p_Var14 = context->args->filter;
                        if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar13->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var14)(&local_15c0);
                        }
                        auVar23 = vpcmpeqd_avx(local_1660,_DAT_01f7aa10);
                        auVar22 = auVar23 ^ _DAT_01f7ae20;
                        auVar77._8_4_ = 0xff800000;
                        auVar77._0_8_ = 0xff800000ff800000;
                        auVar77._12_4_ = 0xff800000;
                        auVar23 = vblendvps_avx(auVar77,*(undefined1 (*) [16])
                                                         (local_15c0.ray + 0x80),auVar23);
                        *(undefined1 (*) [16])(local_15c0.ray + 0x80) = auVar23;
                      }
                      auVar62._8_8_ = 0x100000001;
                      auVar62._0_8_ = 0x100000001;
                      if ((auVar62 & auVar22) != (undefined1  [16])0x0) goto LAB_005fb7a0;
                      *(float *)(ray + k * 4 + 0x80) = local_1500;
                      uVar46 = uVar43 & 0x3f;
                      uVar43 = 0;
                      uVar47 = uVar47 ^ 1L << uVar46;
                      for (uVar46 = uVar47; (uVar46 & 1) == 0;
                          uVar46 = uVar46 >> 1 | 0x8000000000000000) {
                        uVar43 = uVar43 + 1;
                      }
                      auVar112 = ZEXT3264(local_14e0);
                    } while (uVar47 != 0);
                  }
                }
              }
            }
            uVar41 = uVar41 - 1 & uVar41;
          } while (uVar41 != 0);
        }
        local_15d0 = local_15d0 + 1;
        auVar91 = ZEXT3264(local_13c0);
        auVar94 = ZEXT3264(local_13e0);
        auVar98 = ZEXT3264(local_1400);
        auVar101 = ZEXT3264(local_1420);
        auVar104 = ZEXT3264(local_1440);
        auVar107 = ZEXT3264(local_1460);
        auVar111 = ZEXT3264(local_1480);
      } while (local_15d0 != local_15d8);
    }
    bVar55 = local_1610 != &local_1200;
    uVar41 = local_1638;
    uVar43 = local_1618;
    uVar46 = local_1620;
    uVar47 = local_1628;
    uVar48 = local_1630;
    uVar51 = local_1640;
joined_r0x005fae12:
    if (!bVar55) {
      return bVar55;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }